

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase194::run(TestCase194 *this)

{
  initializer_list<unsigned_int> discriminants;
  initializer_list<unsigned_int> discriminants_00;
  initializer_list<unsigned_int> discriminants_01;
  initializer_list<unsigned_int> discriminants_02;
  initializer_list<unsigned_int> discriminants_03;
  initializer_list<unsigned_int> discriminants_04;
  initializer_list<unsigned_int> discriminants_05;
  initializer_list<unsigned_int> discriminants_06;
  initializer_list<unsigned_int> discriminants_07;
  initializer_list<unsigned_int> discriminants_08;
  initializer_list<unsigned_int> discriminants_09;
  initializer_list<unsigned_int> discriminants_10;
  initializer_list<unsigned_int> discriminants_11;
  initializer_list<unsigned_int> discriminants_12;
  initializer_list<unsigned_int> discriminants_13;
  initializer_list<unsigned_int> discriminants_14;
  initializer_list<unsigned_int> discriminants_15;
  initializer_list<unsigned_int> discriminants_16;
  initializer_list<unsigned_int> discriminants_17;
  initializer_list<unsigned_int> discriminants_18;
  initializer_list<unsigned_int> discriminants_19;
  initializer_list<unsigned_int> discriminants_20;
  initializer_list<unsigned_int> discriminants_21;
  initializer_list<unsigned_int> discriminants_22;
  initializer_list<unsigned_int> discriminants_23;
  initializer_list<unsigned_int> discriminants_24;
  initializer_list<unsigned_int> discriminants_25;
  initializer_list<unsigned_int> discriminants_26;
  initializer_list<unsigned_int> discriminants_27;
  initializer_list<unsigned_int> discriminants_28;
  initializer_list<unsigned_int> discriminants_29;
  initializer_list<unsigned_int> discriminants_30;
  initializer_list<unsigned_int> discriminants_31;
  initializer_list<unsigned_int> discriminants_32;
  initializer_list<unsigned_int> discriminants_33;
  initializer_list<unsigned_int> discriminants_34;
  initializer_list<unsigned_int> discriminants_35;
  initializer_list<unsigned_int> discriminants_36;
  initializer_list<unsigned_int> discriminants_37;
  initializer_list<unsigned_int> discriminants_38;
  initializer_list<unsigned_int> discriminants_39;
  initializer_list<unsigned_int> discriminants_40;
  initializer_list<unsigned_int> discriminants_41;
  initializer_list<unsigned_int> discriminants_42;
  initializer_list<unsigned_int> discriminants_43;
  initializer_list<unsigned_int> discriminants_44;
  initializer_list<unsigned_int> discriminants_45;
  initializer_list<unsigned_int> discriminants_46;
  initializer_list<unsigned_int> discriminants_47;
  initializer_list<unsigned_int> discriminants_48;
  initializer_list<unsigned_int> discriminants_49;
  initializer_list<unsigned_int> discriminants_50;
  initializer_list<unsigned_int> discriminants_51;
  initializer_list<unsigned_int> discriminants_52;
  initializer_list<unsigned_int> discriminants_53;
  initializer_list<unsigned_int> discriminants_54;
  initializer_list<unsigned_int> discriminants_55;
  initializer_list<unsigned_int> discriminants_56;
  initializer_list<unsigned_int> discriminants_57;
  initializer_list<unsigned_int> discriminants_58;
  initializer_list<unsigned_int> discriminants_59;
  initializer_list<unsigned_int> discriminants_60;
  initializer_list<unsigned_int> discriminants_61;
  initializer_list<unsigned_int> discriminants_62;
  initializer_list<unsigned_int> discriminants_63;
  initializer_list<unsigned_int> discriminants_64;
  initializer_list<unsigned_int> discriminants_65;
  initializer_list<unsigned_int> discriminants_66;
  initializer_list<unsigned_int> discriminants_67;
  initializer_list<unsigned_int> discriminants_68;
  initializer_list<unsigned_int> discriminants_69;
  initializer_list<unsigned_int> discriminants_70;
  initializer_list<unsigned_int> discriminants_71;
  initializer_list<unsigned_int> discriminants_72;
  initializer_list<unsigned_int> discriminants_73;
  initializer_list<unsigned_int> discriminants_74;
  initializer_list<unsigned_int> discriminants_75;
  initializer_list<unsigned_int> discriminants_76;
  initializer_list<unsigned_int> discriminants_77;
  initializer_list<unsigned_int> discriminants_78;
  initializer_list<unsigned_int> discriminants_79;
  initializer_list<unsigned_int> discriminants_80;
  initializer_list<unsigned_int> discriminants_81;
  initializer_list<unsigned_int> discriminants_82;
  initializer_list<unsigned_int> discriminants_83;
  initializer_list<unsigned_int> discriminants_84;
  initializer_list<unsigned_int> discriminants_85;
  initializer_list<unsigned_int> discriminants_86;
  bool bVar1;
  anon_class_1_0_00000001 *initializer;
  anon_class_1_0_00000001 *initializer_00;
  anon_class_1_0_00000001 *initializer_01;
  anon_class_1_0_00000001 *initializer_02;
  anon_class_1_0_00000001 *initializer_03;
  anon_class_1_0_00000001 *initializer_04;
  anon_class_1_0_00000001 *initializer_05;
  anon_class_1_0_00000001 *initializer_06;
  anon_class_1_0_00000001 *initializer_07;
  anon_class_1_0_00000001 *initializer_08;
  anon_class_1_0_00000001 *initializer_09;
  anon_class_1_0_00000001 *initializer_10;
  anon_class_1_0_00000001 *initializer_11;
  anon_class_1_0_00000001 *initializer_12;
  anon_class_1_0_00000001 *initializer_13;
  anon_class_1_0_00000001 *initializer_14;
  anon_class_1_0_00000001 *initializer_15;
  anon_class_1_0_00000001 *initializer_16;
  anon_class_1_0_00000001 *initializer_17;
  anon_class_1_0_00000001 *initializer_18;
  anon_class_1_0_00000001 *initializer_19;
  anon_class_1_0_00000001 *initializer_20;
  anon_class_1_0_00000001 *initializer_21;
  anon_class_1_0_00000001 *initializer_22;
  anon_class_1_0_00000001 *initializer_23;
  anon_class_1_0_00000001 *initializer_24;
  anon_class_1_0_00000001 *initializer_25;
  anon_class_1_0_00000001 *initializer_26;
  anon_class_1_0_00000001 *initializer_27;
  anon_class_1_0_00000001 *initializer_28;
  anon_class_1_0_00000001 *initializer_29;
  anon_class_1_0_00000001 *initializer_30;
  anon_class_1_0_00000001 *initializer_31;
  anon_class_1_0_00000001 *initializer_32;
  anon_class_1_0_00000001 *initializer_33;
  anon_class_1_0_00000001 *initializer_34;
  anon_class_1_0_00000001 *initializer_35;
  anon_class_1_0_00000001 *initializer_36;
  anon_class_1_0_00000001 *initializer_37;
  anon_class_1_0_00000001 *initializer_38;
  anon_class_1_0_00000001 *initializer_39;
  anon_class_1_0_00000001 *initializer_40;
  anon_class_1_0_00000001 *initializer_41;
  anon_class_1_0_00000001 *initializer_42;
  anon_class_1_0_00000001 *initializer_43;
  anon_class_1_0_00000001 *initializer_44;
  anon_class_1_0_00000001 *initializer_45;
  anon_class_1_0_00000001 *initializer_46;
  anon_class_1_0_00000001 *initializer_47;
  anon_class_1_0_00000001 *initializer_48;
  anon_class_1_0_00000001 *initializer_49;
  anon_class_1_0_00000001 *initializer_50;
  anon_class_1_0_00000001 *initializer_51;
  anon_class_1_0_00000001 *initializer_52;
  anon_class_1_0_00000001 *initializer_53;
  anon_class_1_0_00000001 *initializer_54;
  anon_class_1_0_00000001 *initializer_55;
  anon_class_1_0_00000001 *initializer_56;
  anon_class_1_0_00000001 *initializer_57;
  anon_class_1_0_00000001 *initializer_58;
  anon_class_1_0_00000001 *initializer_59;
  anon_class_1_0_00000001 *initializer_60;
  anon_class_1_0_00000001 *initializer_61;
  anon_class_1_0_00000001 *initializer_62;
  anon_class_1_0_00000001 *initializer_63;
  anon_class_1_0_00000001 *initializer_64;
  anon_class_1_0_00000001 *initializer_65;
  anon_class_1_0_00000001 *initializer_66;
  anon_class_1_0_00000001 *initializer_67;
  anon_class_1_0_00000001 *initializer_68;
  anon_class_1_0_00000001 *initializer_69;
  anon_class_1_0_00000001 *initializer_70;
  anon_class_1_0_00000001 *initializer_71;
  anon_class_1_0_00000001 *initializer_72;
  anon_class_1_0_00000001 *initializer_73;
  anon_class_1_0_00000001 *initializer_74;
  anon_class_1_0_00000001 *initializer_75;
  anon_class_1_0_00000001 *initializer_76;
  anon_class_1_0_00000001 *initializer_77;
  anon_class_1_0_00000001 *initializer_78;
  anon_class_1_0_00000001 *initializer_79;
  anon_class_1_0_00000001 *initializer_80;
  anon_class_1_0_00000001 *initializer_81;
  anon_class_1_0_00000001 *initializer_82;
  anon_class_1_0_00000001 *initializer_83;
  anon_class_1_0_00000001 *initializer_84;
  anon_class_1_0_00000001 *initializer_85;
  anon_class_1_0_00000001 *initializer_86;
  _anonymous_namespace_ local_1b8d;
  UnionState local_1b8c;
  uint local_1b78 [4];
  iterator local_1b68;
  undefined8 local_1b60;
  UnionState local_1b54;
  bool local_1b3e;
  _anonymous_namespace_ local_1b3d;
  undefined1 local_1b3c [6];
  bool _kj_shouldLog_43;
  uint local_1b28 [4];
  iterator local_1b18;
  undefined8 local_1b10;
  UnionState local_1b04;
  _anonymous_namespace_ local_1aed;
  UnionState local_1aec;
  uint local_1ad8 [4];
  iterator local_1ac8;
  undefined8 local_1ac0;
  UnionState local_1ab4;
  bool local_1a9e;
  _anonymous_namespace_ local_1a9d;
  undefined1 local_1a9c [6];
  bool _kj_shouldLog_42;
  uint local_1a88 [4];
  iterator local_1a78;
  undefined8 local_1a70;
  UnionState local_1a64;
  _anonymous_namespace_ local_1a4d;
  UnionState local_1a4c;
  uint local_1a38 [4];
  iterator local_1a28;
  undefined8 local_1a20;
  UnionState local_1a14;
  bool local_19fe;
  _anonymous_namespace_ local_19fd;
  undefined1 local_19fc [6];
  bool _kj_shouldLog_41;
  uint local_19e8 [4];
  iterator local_19d8;
  undefined8 local_19d0;
  UnionState local_19c4;
  _anonymous_namespace_ local_19ad;
  UnionState local_19ac;
  uint local_1998 [4];
  iterator local_1988;
  undefined8 local_1980;
  UnionState local_1974;
  bool local_195e;
  _anonymous_namespace_ local_195d;
  undefined1 local_195c [6];
  bool _kj_shouldLog_40;
  uint local_1948 [4];
  iterator local_1938;
  undefined8 local_1930;
  UnionState local_1924;
  _anonymous_namespace_ local_190d;
  UnionState local_190c;
  uint local_18f8 [4];
  iterator local_18e8;
  undefined8 local_18e0;
  UnionState local_18d4;
  bool local_18be;
  _anonymous_namespace_ local_18bd;
  undefined1 local_18bc [6];
  bool _kj_shouldLog_39;
  uint local_18a8 [4];
  iterator local_1898;
  undefined8 local_1890;
  UnionState local_1884;
  _anonymous_namespace_ local_186d;
  UnionState local_186c;
  uint local_1858 [4];
  iterator local_1848;
  undefined8 local_1840;
  UnionState local_1834;
  bool local_181e;
  _anonymous_namespace_ local_181d;
  undefined1 local_181c [6];
  bool _kj_shouldLog_38;
  uint local_1808 [4];
  iterator local_17f8;
  undefined8 local_17f0;
  UnionState local_17e4;
  _anonymous_namespace_ local_17cd;
  UnionState local_17cc;
  uint local_17b8 [4];
  iterator local_17a8;
  undefined8 local_17a0;
  UnionState local_1794;
  bool local_177e;
  _anonymous_namespace_ local_177d;
  undefined1 local_177c [6];
  bool _kj_shouldLog_37;
  uint local_1768 [4];
  iterator local_1758;
  undefined8 local_1750;
  UnionState local_1744;
  _anonymous_namespace_ local_172d;
  UnionState local_172c;
  uint local_1718 [4];
  iterator local_1708;
  undefined8 local_1700;
  UnionState local_16f4;
  bool local_16de;
  _anonymous_namespace_ local_16dd;
  undefined1 local_16dc [6];
  bool _kj_shouldLog_36;
  uint local_16c8 [4];
  iterator local_16b8;
  undefined8 local_16b0;
  UnionState local_16a4;
  _anonymous_namespace_ local_168d;
  UnionState local_168c;
  uint local_1678 [4];
  iterator local_1668;
  undefined8 local_1660;
  UnionState local_1654;
  bool local_163e;
  _anonymous_namespace_ local_163d;
  undefined1 local_163c [6];
  bool _kj_shouldLog_35;
  uint local_1628 [4];
  iterator local_1618;
  undefined8 local_1610;
  UnionState local_1604;
  _anonymous_namespace_ local_15ed;
  UnionState local_15ec;
  uint local_15d8 [4];
  iterator local_15c8;
  undefined8 local_15c0;
  UnionState local_15b4;
  bool local_159e;
  _anonymous_namespace_ local_159d;
  undefined1 local_159c [6];
  bool _kj_shouldLog_34;
  uint local_1588 [4];
  iterator local_1578;
  undefined8 local_1570;
  UnionState local_1564;
  _anonymous_namespace_ local_154d;
  UnionState local_154c;
  uint local_1538 [4];
  iterator local_1528;
  undefined8 local_1520;
  UnionState local_1514;
  bool local_14fe;
  _anonymous_namespace_ local_14fd;
  undefined1 local_14fc [6];
  bool _kj_shouldLog_33;
  uint local_14e8 [4];
  iterator local_14d8;
  undefined8 local_14d0;
  UnionState local_14c4;
  _anonymous_namespace_ local_14ad;
  UnionState local_14ac;
  uint local_1498 [4];
  iterator local_1488;
  undefined8 local_1480;
  UnionState local_1474;
  bool local_145e;
  _anonymous_namespace_ local_145d;
  undefined1 local_145c [6];
  bool _kj_shouldLog_32;
  uint local_1448 [4];
  iterator local_1438;
  undefined8 local_1430;
  UnionState local_1424;
  _anonymous_namespace_ local_140d;
  UnionState local_140c;
  uint local_13f8 [4];
  iterator local_13e8;
  undefined8 local_13e0;
  UnionState local_13d4;
  bool local_13be;
  _anonymous_namespace_ local_13bd;
  undefined1 local_13bc [6];
  bool _kj_shouldLog_31;
  uint local_13a8 [4];
  iterator local_1398;
  undefined8 local_1390;
  UnionState local_1384;
  _anonymous_namespace_ local_136d;
  UnionState local_136c;
  uint local_1358 [4];
  iterator local_1348;
  undefined8 local_1340;
  UnionState local_1334;
  bool local_131e;
  _anonymous_namespace_ local_131d;
  undefined1 local_131c [6];
  bool _kj_shouldLog_30;
  uint local_1308 [4];
  iterator local_12f8;
  undefined8 local_12f0;
  UnionState local_12e4;
  _anonymous_namespace_ local_12cd;
  UnionState local_12cc;
  uint local_12b8 [4];
  iterator local_12a8;
  undefined8 local_12a0;
  UnionState local_1294;
  bool local_127e;
  _anonymous_namespace_ local_127d;
  undefined1 local_127c [6];
  bool _kj_shouldLog_29;
  uint local_1268 [4];
  iterator local_1258;
  undefined8 local_1250;
  UnionState local_1244;
  _anonymous_namespace_ local_122d;
  UnionState local_122c;
  uint local_1218 [4];
  iterator local_1208;
  undefined8 local_1200;
  UnionState local_11f4;
  bool local_11de;
  _anonymous_namespace_ local_11dd;
  undefined1 local_11dc [6];
  bool _kj_shouldLog_28;
  uint local_11c8 [4];
  iterator local_11b8;
  undefined8 local_11b0;
  UnionState local_11a4;
  _anonymous_namespace_ local_118d;
  UnionState local_118c;
  uint local_1178 [4];
  iterator local_1168;
  undefined8 local_1160;
  UnionState local_1154;
  bool local_113e;
  _anonymous_namespace_ local_113d;
  undefined1 local_113c [6];
  bool _kj_shouldLog_27;
  uint local_1128 [4];
  iterator local_1118;
  undefined8 local_1110;
  UnionState local_1104;
  _anonymous_namespace_ local_10ed;
  UnionState local_10ec;
  uint local_10d8 [4];
  iterator local_10c8;
  undefined8 local_10c0;
  UnionState local_10b4;
  bool local_109e;
  _anonymous_namespace_ local_109d;
  undefined1 local_109c [6];
  bool _kj_shouldLog_26;
  uint local_1088 [4];
  iterator local_1078;
  undefined8 local_1070;
  UnionState local_1064;
  _anonymous_namespace_ local_104d;
  UnionState local_104c;
  uint local_1038 [4];
  iterator local_1028;
  undefined8 local_1020;
  UnionState local_1014;
  bool local_ffe;
  _anonymous_namespace_ local_ffd;
  undefined1 local_ffc [6];
  bool _kj_shouldLog_25;
  uint local_fe8 [4];
  iterator local_fd8;
  undefined8 local_fd0;
  UnionState local_fc4;
  _anonymous_namespace_ local_fad;
  UnionState local_fac;
  uint local_f98 [4];
  iterator local_f88;
  undefined8 local_f80;
  UnionState local_f74;
  bool local_f5e;
  _anonymous_namespace_ local_f5d;
  undefined1 local_f5c [6];
  bool _kj_shouldLog_24;
  uint local_f48 [4];
  iterator local_f38;
  undefined8 local_f30;
  UnionState local_f24;
  _anonymous_namespace_ local_f0d;
  UnionState local_f0c;
  uint local_ef8 [4];
  iterator local_ee8;
  undefined8 local_ee0;
  UnionState local_ed4;
  bool local_ebe;
  _anonymous_namespace_ local_ebd;
  undefined1 local_ebc [6];
  bool _kj_shouldLog_23;
  uint local_ea8 [4];
  iterator local_e98;
  undefined8 local_e90;
  UnionState local_e84;
  _anonymous_namespace_ local_e6d;
  UnionState local_e6c;
  uint local_e58 [4];
  iterator local_e48;
  undefined8 local_e40;
  UnionState local_e34;
  bool local_e1e;
  _anonymous_namespace_ local_e1d;
  undefined1 local_e1c [6];
  bool _kj_shouldLog_22;
  uint local_e08 [4];
  iterator local_df8;
  undefined8 local_df0;
  UnionState local_de4;
  _anonymous_namespace_ local_dcd;
  UnionState local_dcc;
  uint local_db8 [4];
  iterator local_da8;
  undefined8 local_da0;
  UnionState local_d94;
  bool local_d7e;
  _anonymous_namespace_ local_d7d;
  undefined1 local_d7c [6];
  bool _kj_shouldLog_21;
  uint local_d68 [4];
  iterator local_d58;
  undefined8 local_d50;
  UnionState local_d44;
  _anonymous_namespace_ local_d2d;
  UnionState local_d2c;
  uint local_d18 [4];
  iterator local_d08;
  undefined8 local_d00;
  UnionState local_cf4;
  bool local_cde;
  _anonymous_namespace_ local_cdd;
  undefined1 local_cdc [6];
  bool _kj_shouldLog_20;
  uint local_cc8 [4];
  iterator local_cb8;
  undefined8 local_cb0;
  UnionState local_ca4;
  _anonymous_namespace_ local_c8d;
  UnionState local_c8c;
  uint local_c78 [4];
  iterator local_c68;
  undefined8 local_c60;
  UnionState local_c54;
  bool local_c3e;
  _anonymous_namespace_ local_c3d;
  undefined1 local_c3c [6];
  bool _kj_shouldLog_19;
  uint local_c28 [4];
  iterator local_c18;
  undefined8 local_c10;
  UnionState local_c04;
  _anonymous_namespace_ local_bed;
  UnionState local_bec;
  uint local_bd8 [4];
  iterator local_bc8;
  undefined8 local_bc0;
  UnionState local_bb4;
  bool local_b9e;
  _anonymous_namespace_ local_b9d;
  undefined1 local_b9c [6];
  bool _kj_shouldLog_18;
  uint local_b88 [4];
  iterator local_b78;
  undefined8 local_b70;
  UnionState local_b64;
  _anonymous_namespace_ local_b4d;
  UnionState local_b4c;
  uint local_b38 [4];
  iterator local_b28;
  undefined8 local_b20;
  UnionState local_b14;
  bool local_afe;
  _anonymous_namespace_ local_afd;
  undefined1 local_afc [6];
  bool _kj_shouldLog_17;
  uint local_ae8 [4];
  iterator local_ad8;
  undefined8 local_ad0;
  UnionState local_ac4;
  _anonymous_namespace_ local_aad;
  UnionState local_aac;
  uint local_a98 [4];
  iterator local_a88;
  undefined8 local_a80;
  UnionState local_a74;
  bool local_a5e;
  _anonymous_namespace_ local_a5d;
  undefined1 local_a5c [6];
  bool _kj_shouldLog_16;
  uint local_a48 [4];
  iterator local_a38;
  undefined8 local_a30;
  UnionState local_a24;
  _anonymous_namespace_ local_a0d;
  UnionState local_a0c;
  uint local_9f8 [4];
  iterator local_9e8;
  undefined8 local_9e0;
  UnionState local_9d4;
  bool local_9be;
  _anonymous_namespace_ local_9bd;
  undefined1 local_9bc [6];
  bool _kj_shouldLog_15;
  uint local_9a8 [4];
  iterator local_998;
  undefined8 local_990;
  UnionState local_984;
  _anonymous_namespace_ local_96d;
  UnionState local_96c;
  uint local_958 [4];
  iterator local_948;
  undefined8 local_940;
  UnionState local_934;
  bool local_91e;
  _anonymous_namespace_ local_91d;
  undefined1 local_91c [6];
  bool _kj_shouldLog_14;
  uint local_908 [4];
  iterator local_8f8;
  undefined8 local_8f0;
  UnionState local_8e4;
  _anonymous_namespace_ local_8cd;
  UnionState local_8cc;
  uint local_8b8 [4];
  iterator local_8a8;
  undefined8 local_8a0;
  UnionState local_894;
  bool local_87e;
  _anonymous_namespace_ local_87d;
  undefined1 local_87c [6];
  bool _kj_shouldLog_13;
  uint local_868 [4];
  iterator local_858;
  undefined8 local_850;
  UnionState local_844;
  _anonymous_namespace_ local_82d;
  UnionState local_82c;
  uint local_818 [4];
  iterator local_808;
  undefined8 local_800;
  UnionState local_7f4;
  bool local_7de;
  _anonymous_namespace_ local_7dd;
  undefined1 local_7dc [6];
  bool _kj_shouldLog_12;
  uint local_7c8 [4];
  iterator local_7b8;
  undefined8 local_7b0;
  UnionState local_7a4;
  _anonymous_namespace_ local_78d;
  UnionState local_78c;
  uint local_778 [4];
  iterator local_768;
  undefined8 local_760;
  UnionState local_754;
  bool local_73e;
  _anonymous_namespace_ local_73d;
  undefined1 local_73c [6];
  bool _kj_shouldLog_11;
  uint local_728 [4];
  iterator local_718;
  undefined8 local_710;
  UnionState local_704;
  _anonymous_namespace_ local_6ed;
  UnionState local_6ec;
  uint local_6d8 [4];
  iterator local_6c8;
  undefined8 local_6c0;
  UnionState local_6b4;
  bool local_69e;
  _anonymous_namespace_ local_69d;
  undefined1 local_69c [6];
  bool _kj_shouldLog_10;
  uint local_688 [4];
  iterator local_678;
  undefined8 local_670;
  UnionState local_664;
  _anonymous_namespace_ local_64d;
  UnionState local_64c;
  uint local_638 [4];
  iterator local_628;
  undefined8 local_620;
  UnionState local_614;
  bool local_5fe;
  _anonymous_namespace_ local_5fd;
  undefined1 local_5fc [6];
  bool _kj_shouldLog_9;
  uint local_5e8 [4];
  iterator local_5d8;
  undefined8 local_5d0;
  UnionState local_5c4;
  _anonymous_namespace_ local_5ad;
  UnionState local_5ac;
  uint local_598 [4];
  iterator local_588;
  undefined8 local_580;
  UnionState local_574;
  bool local_55e;
  _anonymous_namespace_ local_55d;
  undefined1 local_55c [6];
  bool _kj_shouldLog_8;
  uint local_548 [4];
  iterator local_538;
  undefined8 local_530;
  UnionState local_524;
  _anonymous_namespace_ local_50d;
  UnionState local_50c;
  uint local_4f8 [4];
  iterator local_4e8;
  undefined8 local_4e0;
  UnionState local_4d4;
  bool local_4be;
  _anonymous_namespace_ local_4bd;
  undefined1 local_4bc [6];
  bool _kj_shouldLog_7;
  uint local_4a8 [4];
  iterator local_498;
  undefined8 local_490;
  UnionState local_484;
  _anonymous_namespace_ local_46d;
  UnionState local_46c;
  uint local_458 [4];
  iterator local_448;
  undefined8 local_440;
  UnionState local_434;
  bool local_41e;
  _anonymous_namespace_ local_41d;
  undefined1 local_41c [6];
  bool _kj_shouldLog_6;
  uint local_408 [4];
  iterator local_3f8;
  undefined8 local_3f0;
  UnionState local_3e4;
  _anonymous_namespace_ local_3cd;
  UnionState local_3cc;
  uint local_3b8 [4];
  iterator local_3a8;
  undefined8 local_3a0;
  UnionState local_394;
  bool local_37e;
  _anonymous_namespace_ local_37d;
  undefined1 local_37c [6];
  bool _kj_shouldLog_5;
  uint local_368 [4];
  iterator local_358;
  undefined8 local_350;
  UnionState local_344;
  _anonymous_namespace_ local_32d;
  UnionState local_32c;
  uint local_318 [4];
  iterator local_308;
  undefined8 local_300;
  UnionState local_2f4;
  bool local_2de;
  _anonymous_namespace_ local_2dd;
  undefined1 local_2dc [6];
  bool _kj_shouldLog_4;
  uint local_2c8 [4];
  iterator local_2b8;
  undefined8 local_2b0;
  UnionState local_2a4;
  _anonymous_namespace_ local_28d;
  UnionState local_28c;
  uint local_278 [4];
  iterator local_268;
  undefined8 local_260;
  UnionState local_254;
  bool local_23e;
  _anonymous_namespace_ local_23d;
  undefined1 local_23c [6];
  bool _kj_shouldLog_3;
  uint local_228 [4];
  iterator local_218;
  undefined8 local_210;
  UnionState local_204;
  _anonymous_namespace_ local_1ed;
  UnionState local_1ec;
  uint local_1d8 [4];
  iterator local_1c8;
  undefined8 local_1c0;
  UnionState local_1b4;
  bool local_19e;
  _anonymous_namespace_ local_19d;
  undefined1 local_19c [6];
  bool _kj_shouldLog_2;
  uint local_188 [4];
  iterator local_178;
  undefined8 local_170;
  UnionState local_164;
  _anonymous_namespace_ local_14d;
  UnionState local_14c;
  uint local_138 [4];
  iterator local_128;
  undefined8 local_120;
  UnionState local_114;
  bool local_fe;
  _anonymous_namespace_ local_fd;
  undefined1 local_fc [6];
  bool _kj_shouldLog_1;
  uint local_e8 [4];
  iterator local_d8;
  undefined8 local_d0;
  UnionState local_c4;
  _anonymous_namespace_ local_ad;
  UnionState local_ac;
  uint local_98 [4];
  iterator local_88;
  undefined8 local_80;
  UnionState local_74;
  bool local_5e;
  _anonymous_namespace_ local_5d;
  undefined1 local_5c [6];
  bool _kj_shouldLog;
  uint local_48 [4];
  iterator local_38;
  undefined8 local_30;
  UnionState local_24;
  TestCase194 *local_10;
  TestCase194 *this_local;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_38 = local_48;
  local_30 = 4;
  discriminants_86._M_len = 4;
  discriminants_86._M_array = local_38;
  local_10 = this;
  UnionState::UnionState(&local_24,discriminants_86,-1);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__0>
            ((UnionState *)local_5c,&local_5d,initializer);
  bVar1 = UnionState::operator==(&local_24,(UnionState *)local_5c);
  if (!bVar1) {
    local_5e = kj::_::Debug::shouldLog(ERROR);
    while (local_5e != false) {
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_88 = local_98;
      local_80 = 4;
      discriminants_85._M_len = 4;
      discriminants_85._M_array = local_88;
      UnionState::UnionState(&local_74,discriminants_85,-1);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__1>
                (&local_ac,&local_ad,initializer_00);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xc6,ERROR,
                 "\"failed: expected \" \"(UnionState({ 0,0,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s0(VOID);}))\", UnionState({ 0,0,0,0}, -1), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s0(VOID);})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({ 0,0,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s0(VOID);}))"
                 ,&local_74,&local_ac);
      local_5e = false;
    }
  }
  local_e8[0] = 1;
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_d8 = local_e8;
  local_d0 = 4;
  discriminants_84._M_len = 4;
  discriminants_84._M_array = local_d8;
  UnionState::UnionState(&local_c4,discriminants_84,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__2>
            ((UnionState *)local_fc,&local_fd,initializer_01);
  bVar1 = UnionState::operator==(&local_c4,(UnionState *)local_fc);
  if (!bVar1) {
    local_fe = kj::_::Debug::shouldLog(ERROR);
    while (local_fe != false) {
      local_138[0] = 1;
      local_138[1] = 0;
      local_138[2] = 0;
      local_138[3] = 0;
      local_128 = local_138;
      local_120 = 4;
      discriminants_83._M_len = 4;
      discriminants_83._M_array = local_128;
      UnionState::UnionState(&local_114,discriminants_83,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__3>
                (&local_14c,&local_14d,initializer_02);
      kj::_::Debug::
      log<char_const(&)[127],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,199,ERROR,
                 "\"failed: expected \" \"(UnionState({ 1,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s1(1);}))\", UnionState({ 1,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s1(1);})"
                 ,(char (*) [127])
                  "failed: expected (UnionState({ 1,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s1(1);}))"
                 ,&local_114,&local_14c);
      local_fe = false;
    }
  }
  local_188[0] = 2;
  local_188[1] = 0;
  local_188[2] = 0;
  local_188[3] = 0;
  local_178 = local_188;
  local_170 = 4;
  discriminants_82._M_len = 4;
  discriminants_82._M_array = local_178;
  UnionState::UnionState(&local_164,discriminants_82,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__4>
            ((UnionState *)local_19c,&local_19d,initializer_03);
  bVar1 = UnionState::operator==(&local_164,(UnionState *)local_19c);
  if (!bVar1) {
    local_19e = kj::_::Debug::shouldLog(ERROR);
    while (local_19e != false) {
      local_1d8[0] = 2;
      local_1d8[1] = 0;
      local_1d8[2] = 0;
      local_1d8[3] = 0;
      local_1c8 = local_1d8;
      local_1c0 = 4;
      discriminants_81._M_len = 4;
      discriminants_81._M_array = local_1c8;
      UnionState::UnionState(&local_1b4,discriminants_81,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__5>
                (&local_1ec,&local_1ed,initializer_04);
      kj::_::Debug::
      log<char_const(&)[127],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,200,ERROR,
                 "\"failed: expected \" \"(UnionState({ 2,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s8(1);}))\", UnionState({ 2,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s8(1);})"
                 ,(char (*) [127])
                  "failed: expected (UnionState({ 2,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s8(1);}))"
                 ,&local_1b4,&local_1ec);
      local_19e = false;
    }
  }
  local_228[0] = 3;
  local_228[1] = 0;
  local_228[2] = 0;
  local_228[3] = 0;
  local_218 = local_228;
  local_210 = 4;
  discriminants_80._M_len = 4;
  discriminants_80._M_array = local_218;
  UnionState::UnionState(&local_204,discriminants_80,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__6>
            ((UnionState *)local_23c,&local_23d,initializer_05);
  bVar1 = UnionState::operator==(&local_204,(UnionState *)local_23c);
  if (!bVar1) {
    local_23e = kj::_::Debug::shouldLog(ERROR);
    while (local_23e != false) {
      local_278[0] = 3;
      local_278[1] = 0;
      local_278[2] = 0;
      local_278[3] = 0;
      local_268 = local_278;
      local_260 = 4;
      discriminants_79._M_len = 4;
      discriminants_79._M_array = local_268;
      UnionState::UnionState(&local_254,discriminants_79,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__7>
                (&local_28c,&local_28d,initializer_06);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xc9,ERROR,
                 "\"failed: expected \" \"(UnionState({ 3,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s16(1);}))\", UnionState({ 3,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s16(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({ 3,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s16(1);}))"
                 ,&local_254,&local_28c);
      local_23e = false;
    }
  }
  local_2c8[0] = 4;
  local_2c8[1] = 0;
  local_2c8[2] = 0;
  local_2c8[3] = 0;
  local_2b8 = local_2c8;
  local_2b0 = 4;
  discriminants_78._M_len = 4;
  discriminants_78._M_array = local_2b8;
  UnionState::UnionState(&local_2a4,discriminants_78,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__8>
            ((UnionState *)local_2dc,&local_2dd,initializer_07);
  bVar1 = UnionState::operator==(&local_2a4,(UnionState *)local_2dc);
  if (!bVar1) {
    local_2de = kj::_::Debug::shouldLog(ERROR);
    while (local_2de != false) {
      local_318[0] = 4;
      local_318[1] = 0;
      local_318[2] = 0;
      local_318[3] = 0;
      local_308 = local_318;
      local_300 = 4;
      discriminants_77._M_len = 4;
      discriminants_77._M_array = local_308;
      UnionState::UnionState(&local_2f4,discriminants_77,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__9>
                (&local_32c,&local_32d,initializer_08);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xca,ERROR,
                 "\"failed: expected \" \"(UnionState({ 4,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s32(1);}))\", UnionState({ 4,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s32(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({ 4,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s32(1);}))"
                 ,&local_2f4,&local_32c);
      local_2de = false;
    }
  }
  local_368[0] = 5;
  local_368[1] = 0;
  local_368[2] = 0;
  local_368[3] = 0;
  local_358 = local_368;
  local_350 = 4;
  discriminants_76._M_len = 4;
  discriminants_76._M_array = local_358;
  UnionState::UnionState(&local_344,discriminants_76,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__10>
            ((UnionState *)local_37c,&local_37d,initializer_09);
  bVar1 = UnionState::operator==(&local_344,(UnionState *)local_37c);
  if (!bVar1) {
    local_37e = kj::_::Debug::shouldLog(ERROR);
    while (local_37e != false) {
      local_3b8[0] = 5;
      local_3b8[1] = 0;
      local_3b8[2] = 0;
      local_3b8[3] = 0;
      local_3a8 = local_3b8;
      local_3a0 = 4;
      discriminants_75._M_len = 4;
      discriminants_75._M_array = local_3a8;
      UnionState::UnionState(&local_394,discriminants_75,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__11>
                (&local_3cc,&local_3cd,initializer_10);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xcb,ERROR,
                 "\"failed: expected \" \"(UnionState({ 5,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s64(1);}))\", UnionState({ 5,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s64(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({ 5,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0s64(1);}))"
                 ,&local_394,&local_3cc);
      local_37e = false;
    }
  }
  local_408[0] = 6;
  local_408[1] = 0;
  local_408[2] = 0;
  local_408[3] = 0;
  local_3f8 = local_408;
  local_3f0 = 4;
  discriminants_74._M_len = 4;
  discriminants_74._M_array = local_3f8;
  UnionState::UnionState(&local_3e4,discriminants_74,0x1c0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__12>
            ((UnionState *)local_41c,&local_41d,initializer_11);
  bVar1 = UnionState::operator==(&local_3e4,(UnionState *)local_41c);
  if (!bVar1) {
    local_41e = kj::_::Debug::shouldLog(ERROR);
    while (local_41e != false) {
      local_458[0] = 6;
      local_458[1] = 0;
      local_458[2] = 0;
      local_458[3] = 0;
      local_448 = local_458;
      local_440 = 4;
      discriminants_73._M_len = 4;
      discriminants_73._M_array = local_448;
      UnionState::UnionState(&local_434,discriminants_73,0x1c0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__13>
                (&local_46c,&local_46d,initializer_12);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xcc,ERROR,
                 "\"failed: expected \" \"(UnionState({ 6,0,0,0}, 448)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0sp(\\\"1\\\");}))\", UnionState({ 6,0,0,0}, 448), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0sp(\"1\");})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({ 6,0,0,0}, 448)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f0sp(\"1\");}))"
                 ,&local_434,&local_46c);
      local_41e = false;
    }
  }
  local_4a8[0] = 7;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_498 = local_4a8;
  local_490 = 4;
  discriminants_72._M_len = 4;
  discriminants_72._M_array = local_498;
  UnionState::UnionState(&local_484,discriminants_72,-1);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__14>
            ((UnionState *)local_4bc,&local_4bd,initializer_13);
  bVar1 = UnionState::operator==(&local_484,(UnionState *)local_4bc);
  if (!bVar1) {
    local_4be = kj::_::Debug::shouldLog(ERROR);
    while (local_4be != false) {
      local_4f8[0] = 7;
      local_4f8[1] = 0;
      local_4f8[2] = 0;
      local_4f8[3] = 0;
      local_4e8 = local_4f8;
      local_4e0 = 4;
      discriminants_71._M_len = 4;
      discriminants_71._M_array = local_4e8;
      UnionState::UnionState(&local_4d4,discriminants_71,-1);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__15>
                (&local_50c,&local_50d,initializer_14);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"(UnionState({ 7,0,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s0(VOID);}))\", UnionState({ 7,0,0,0}, -1), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s0(VOID);})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({ 7,0,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s0(VOID);}))"
                 ,&local_4d4,&local_50c);
      local_4be = false;
    }
  }
  local_548[0] = 8;
  local_548[1] = 0;
  local_548[2] = 0;
  local_548[3] = 0;
  local_538 = local_548;
  local_530 = 4;
  discriminants_70._M_len = 4;
  discriminants_70._M_array = local_538;
  UnionState::UnionState(&local_524,discriminants_70,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__16>
            ((UnionState *)local_55c,&local_55d,initializer_15);
  bVar1 = UnionState::operator==(&local_524,(UnionState *)local_55c);
  if (!bVar1) {
    local_55e = kj::_::Debug::shouldLog(ERROR);
    while (local_55e != false) {
      local_598[0] = 8;
      local_598[1] = 0;
      local_598[2] = 0;
      local_598[3] = 0;
      local_588 = local_598;
      local_580 = 4;
      discriminants_69._M_len = 4;
      discriminants_69._M_array = local_588;
      UnionState::UnionState(&local_574,discriminants_69,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__17>
                (&local_5ac,&local_5ad,initializer_16);
      kj::_::Debug::
      log<char_const(&)[127],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xcf,ERROR,
                 "\"failed: expected \" \"(UnionState({ 8,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s1(1);}))\", UnionState({ 8,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s1(1);})"
                 ,(char (*) [127])
                  "failed: expected (UnionState({ 8,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s1(1);}))"
                 ,&local_574,&local_5ac);
      local_55e = false;
    }
  }
  local_5e8[0] = 9;
  local_5e8[1] = 0;
  local_5e8[2] = 0;
  local_5e8[3] = 0;
  local_5d8 = local_5e8;
  local_5d0 = 4;
  discriminants_68._M_len = 4;
  discriminants_68._M_array = local_5d8;
  UnionState::UnionState(&local_5c4,discriminants_68,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__18>
            ((UnionState *)local_5fc,&local_5fd,initializer_17);
  bVar1 = UnionState::operator==(&local_5c4,(UnionState *)local_5fc);
  if (!bVar1) {
    local_5fe = kj::_::Debug::shouldLog(ERROR);
    while (local_5fe != false) {
      local_638[0] = 9;
      local_638[1] = 0;
      local_638[2] = 0;
      local_638[3] = 0;
      local_628 = local_638;
      local_620 = 4;
      discriminants_67._M_len = 4;
      discriminants_67._M_array = local_628;
      UnionState::UnionState(&local_614,discriminants_67,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__19>
                (&local_64c,&local_64d,initializer_18);
      kj::_::Debug::
      log<char_const(&)[127],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd0,ERROR,
                 "\"failed: expected \" \"(UnionState({ 9,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s8(1);}))\", UnionState({ 9,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s8(1);})"
                 ,(char (*) [127])
                  "failed: expected (UnionState({ 9,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s8(1);}))"
                 ,&local_614,&local_64c);
      local_5fe = false;
    }
  }
  local_688[0] = 10;
  local_688[1] = 0;
  local_688[2] = 0;
  local_688[3] = 0;
  local_678 = local_688;
  local_670 = 4;
  discriminants_66._M_len = 4;
  discriminants_66._M_array = local_678;
  UnionState::UnionState(&local_664,discriminants_66,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__20>
            ((UnionState *)local_69c,&local_69d,initializer_19);
  bVar1 = UnionState::operator==(&local_664,(UnionState *)local_69c);
  if (!bVar1) {
    local_69e = kj::_::Debug::shouldLog(ERROR);
    while (local_69e != false) {
      local_6d8[0] = 10;
      local_6d8[1] = 0;
      local_6d8[2] = 0;
      local_6d8[3] = 0;
      local_6c8 = local_6d8;
      local_6c0 = 4;
      discriminants_65._M_len = 4;
      discriminants_65._M_array = local_6c8;
      UnionState::UnionState(&local_6b4,discriminants_65,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__21>
                (&local_6ec,&local_6ed,initializer_20);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd1,ERROR,
                 "\"failed: expected \" \"(UnionState({10,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s16(1);}))\", UnionState({10,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s16(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({10,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s16(1);}))"
                 ,&local_6b4,&local_6ec);
      local_69e = false;
    }
  }
  local_728[0] = 0xb;
  local_728[1] = 0;
  local_728[2] = 0;
  local_728[3] = 0;
  local_718 = local_728;
  local_710 = 4;
  discriminants_64._M_len = 4;
  discriminants_64._M_array = local_718;
  UnionState::UnionState(&local_704,discriminants_64,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__22>
            ((UnionState *)local_73c,&local_73d,initializer_21);
  bVar1 = UnionState::operator==(&local_704,(UnionState *)local_73c);
  if (!bVar1) {
    local_73e = kj::_::Debug::shouldLog(ERROR);
    while (local_73e != false) {
      local_778[0] = 0xb;
      local_778[1] = 0;
      local_778[2] = 0;
      local_778[3] = 0;
      local_768 = local_778;
      local_760 = 4;
      discriminants_63._M_len = 4;
      discriminants_63._M_array = local_768;
      UnionState::UnionState(&local_754,discriminants_63,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__23>
                (&local_78c,&local_78d,initializer_22);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd2,ERROR,
                 "\"failed: expected \" \"(UnionState({11,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s32(1);}))\", UnionState({11,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s32(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({11,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s32(1);}))"
                 ,&local_754,&local_78c);
      local_73e = false;
    }
  }
  local_7c8[0] = 0xc;
  local_7c8[1] = 0;
  local_7c8[2] = 0;
  local_7c8[3] = 0;
  local_7b8 = local_7c8;
  local_7b0 = 4;
  discriminants_62._M_len = 4;
  discriminants_62._M_array = local_7b8;
  UnionState::UnionState(&local_7a4,discriminants_62,0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__24>
            ((UnionState *)local_7dc,&local_7dd,initializer_23);
  bVar1 = UnionState::operator==(&local_7a4,(UnionState *)local_7dc);
  if (!bVar1) {
    local_7de = kj::_::Debug::shouldLog(ERROR);
    while (local_7de != false) {
      local_818[0] = 0xc;
      local_818[1] = 0;
      local_818[2] = 0;
      local_818[3] = 0;
      local_808 = local_818;
      local_800 = 4;
      discriminants_61._M_len = 4;
      discriminants_61._M_array = local_808;
      UnionState::UnionState(&local_7f4,discriminants_61,0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__25>
                (&local_82c,&local_82d,initializer_24);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd3,ERROR,
                 "\"failed: expected \" \"(UnionState({12,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s64(1);}))\", UnionState({12,0,0,0}, 0), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s64(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({12,0,0,0}, 0)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1s64(1);}))"
                 ,&local_7f4,&local_82c);
      local_7de = false;
    }
  }
  local_868[0] = 0xd;
  local_868[1] = 0;
  local_868[2] = 0;
  local_868[3] = 0;
  local_858 = local_868;
  local_850 = 4;
  discriminants_60._M_len = 4;
  discriminants_60._M_array = local_858;
  UnionState::UnionState(&local_844,discriminants_60,0x1c0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__26>
            ((UnionState *)local_87c,&local_87d,initializer_25);
  bVar1 = UnionState::operator==(&local_844,(UnionState *)local_87c);
  if (!bVar1) {
    local_87e = kj::_::Debug::shouldLog(ERROR);
    while (local_87e != false) {
      local_8b8[0] = 0xd;
      local_8b8[1] = 0;
      local_8b8[2] = 0;
      local_8b8[3] = 0;
      local_8a8 = local_8b8;
      local_8a0 = 4;
      discriminants_59._M_len = 4;
      discriminants_59._M_array = local_8a8;
      UnionState::UnionState(&local_894,discriminants_59,0x1c0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__27>
                (&local_8cc,&local_8cd,initializer_26);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd4,ERROR,
                 "\"failed: expected \" \"(UnionState({13,0,0,0}, 448)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1sp(\\\"1\\\");}))\", UnionState({13,0,0,0}, 448), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1sp(\"1\");})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({13,0,0,0}, 448)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion0().setU0f1sp(\"1\");}))"
                 ,&local_894,&local_8cc);
      local_87e = false;
    }
  }
  local_908[0] = 0;
  local_908[1] = 0;
  local_908[2] = 0;
  local_908[3] = 0;
  local_8f8 = local_908;
  local_8f0 = 4;
  discriminants_58._M_len = 4;
  discriminants_58._M_array = local_8f8;
  UnionState::UnionState(&local_8e4,discriminants_58,-1);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__28>
            ((UnionState *)local_91c,&local_91d,initializer_27);
  bVar1 = UnionState::operator==(&local_8e4,(UnionState *)local_91c);
  if (!bVar1) {
    local_91e = kj::_::Debug::shouldLog(ERROR);
    while (local_91e != false) {
      local_958[0] = 0;
      local_958[1] = 0;
      local_958[2] = 0;
      local_958[3] = 0;
      local_948 = local_958;
      local_940 = 4;
      discriminants_57._M_len = 4;
      discriminants_57._M_array = local_948;
      UnionState::UnionState(&local_934,discriminants_57,-1);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__29>
                (&local_96c,&local_96d,initializer_28);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd6,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 0,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s0(VOID);}))\", UnionState({0, 0,0,0}, -1), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s0(VOID);})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({0, 0,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s0(VOID);}))"
                 ,&local_934,&local_96c);
      local_91e = false;
    }
  }
  local_9a8[0] = 0;
  local_9a8[1] = 1;
  local_9a8[2] = 0;
  local_9a8[3] = 0;
  local_998 = local_9a8;
  local_990 = 4;
  discriminants_56._M_len = 4;
  discriminants_56._M_array = local_998;
  UnionState::UnionState(&local_984,discriminants_56,0x41);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__30>
            ((UnionState *)local_9bc,&local_9bd,initializer_29);
  bVar1 = UnionState::operator==(&local_984,(UnionState *)local_9bc);
  if (!bVar1) {
    local_9be = kj::_::Debug::shouldLog(ERROR);
    while (local_9be != false) {
      local_9f8[0] = 0;
      local_9f8[1] = 1;
      local_9f8[2] = 0;
      local_9f8[3] = 0;
      local_9e8 = local_9f8;
      local_9e0 = 4;
      discriminants_55._M_len = 4;
      discriminants_55._M_array = local_9e8;
      UnionState::UnionState(&local_9d4,discriminants_55,0x41);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__31>
                (&local_a0c,&local_a0d,initializer_30);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd7,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 1,0,0}, 65)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s1(1);}))\", UnionState({0, 1,0,0}, 65), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s1(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0, 1,0,0}, 65)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s1(1);}))"
                 ,&local_9d4,&local_a0c);
      local_9be = false;
    }
  }
  local_a48[0] = 0;
  local_a48[1] = 2;
  local_a48[2] = 0;
  local_a48[3] = 0;
  local_a38 = local_a48;
  local_a30 = 4;
  discriminants_54._M_len = 4;
  discriminants_54._M_array = local_a38;
  UnionState::UnionState(&local_a24,discriminants_54,0x41);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__32>
            ((UnionState *)local_a5c,&local_a5d,initializer_31);
  bVar1 = UnionState::operator==(&local_a24,(UnionState *)local_a5c);
  if (!bVar1) {
    local_a5e = kj::_::Debug::shouldLog(ERROR);
    while (local_a5e != false) {
      local_a98[0] = 0;
      local_a98[1] = 2;
      local_a98[2] = 0;
      local_a98[3] = 0;
      local_a88 = local_a98;
      local_a80 = 4;
      discriminants_53._M_len = 4;
      discriminants_53._M_array = local_a88;
      UnionState::UnionState(&local_a74,discriminants_53,0x41);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__33>
                (&local_aac,&local_aad,initializer_32);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd8,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 2,0,0}, 65)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s1(1);}))\", UnionState({0, 2,0,0}, 65), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s1(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0, 2,0,0}, 65)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s1(1);}))"
                 ,&local_a74,&local_aac);
      local_a5e = false;
    }
  }
  local_ae8[0] = 0;
  local_ae8[1] = 3;
  local_ae8[2] = 0;
  local_ae8[3] = 0;
  local_ad8 = local_ae8;
  local_ad0 = 4;
  discriminants_52._M_len = 4;
  discriminants_52._M_array = local_ad8;
  UnionState::UnionState(&local_ac4,discriminants_52,0x48);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__34>
            ((UnionState *)local_afc,&local_afd,initializer_33);
  bVar1 = UnionState::operator==(&local_ac4,(UnionState *)local_afc);
  if (!bVar1) {
    local_afe = kj::_::Debug::shouldLog(ERROR);
    while (local_afe != false) {
      local_b38[0] = 0;
      local_b38[1] = 3;
      local_b38[2] = 0;
      local_b38[3] = 0;
      local_b28 = local_b38;
      local_b20 = 4;
      discriminants_51._M_len = 4;
      discriminants_51._M_array = local_b28;
      UnionState::UnionState(&local_b14,discriminants_51,0x48);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__35>
                (&local_b4c,&local_b4d,initializer_34);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xd9,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 3,0,0}, 72)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s8(1);}))\", UnionState({0, 3,0,0}, 72), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s8(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0, 3,0,0}, 72)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s8(1);}))"
                 ,&local_b14,&local_b4c);
      local_afe = false;
    }
  }
  local_b88[0] = 0;
  local_b88[1] = 4;
  local_b88[2] = 0;
  local_b88[3] = 0;
  local_b78 = local_b88;
  local_b70 = 4;
  discriminants_50._M_len = 4;
  discriminants_50._M_array = local_b78;
  UnionState::UnionState(&local_b64,discriminants_50,0x48);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__36>
            ((UnionState *)local_b9c,&local_b9d,initializer_35);
  bVar1 = UnionState::operator==(&local_b64,(UnionState *)local_b9c);
  if (!bVar1) {
    local_b9e = kj::_::Debug::shouldLog(ERROR);
    while (local_b9e != false) {
      local_bd8[0] = 0;
      local_bd8[1] = 4;
      local_bd8[2] = 0;
      local_bd8[3] = 0;
      local_bc8 = local_bd8;
      local_bc0 = 4;
      discriminants_49._M_len = 4;
      discriminants_49._M_array = local_bc8;
      UnionState::UnionState(&local_bb4,discriminants_49,0x48);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__37>
                (&local_bec,&local_bed,initializer_36);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xda,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 4,0,0}, 72)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s8(1);}))\", UnionState({0, 4,0,0}, 72), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s8(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0, 4,0,0}, 72)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s8(1);}))"
                 ,&local_bb4,&local_bec);
      local_b9e = false;
    }
  }
  local_c28[0] = 0;
  local_c28[1] = 5;
  local_c28[2] = 0;
  local_c28[3] = 0;
  local_c18 = local_c28;
  local_c10 = 4;
  discriminants_48._M_len = 4;
  discriminants_48._M_array = local_c18;
  UnionState::UnionState(&local_c04,discriminants_48,0x50);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__38>
            ((UnionState *)local_c3c,&local_c3d,initializer_37);
  bVar1 = UnionState::operator==(&local_c04,(UnionState *)local_c3c);
  if (!bVar1) {
    local_c3e = kj::_::Debug::shouldLog(ERROR);
    while (local_c3e != false) {
      local_c78[0] = 0;
      local_c78[1] = 5;
      local_c78[2] = 0;
      local_c78[3] = 0;
      local_c68 = local_c78;
      local_c60 = 4;
      discriminants_47._M_len = 4;
      discriminants_47._M_array = local_c68;
      UnionState::UnionState(&local_c54,discriminants_47,0x50);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__39>
                (&local_c8c,&local_c8d,initializer_38);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 5,0,0}, 80)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s16(1);}))\", UnionState({0, 5,0,0}, 80), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s16(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0, 5,0,0}, 80)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s16(1);}))"
                 ,&local_c54,&local_c8c);
      local_c3e = false;
    }
  }
  local_cc8[0] = 0;
  local_cc8[1] = 6;
  local_cc8[2] = 0;
  local_cc8[3] = 0;
  local_cb8 = local_cc8;
  local_cb0 = 4;
  discriminants_46._M_len = 4;
  discriminants_46._M_array = local_cb8;
  UnionState::UnionState(&local_ca4,discriminants_46,0x50);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__40>
            ((UnionState *)local_cdc,&local_cdd,initializer_39);
  bVar1 = UnionState::operator==(&local_ca4,(UnionState *)local_cdc);
  if (!bVar1) {
    local_cde = kj::_::Debug::shouldLog(ERROR);
    while (local_cde != false) {
      local_d18[0] = 0;
      local_d18[1] = 6;
      local_d18[2] = 0;
      local_d18[3] = 0;
      local_d08 = local_d18;
      local_d00 = 4;
      discriminants_45._M_len = 4;
      discriminants_45._M_array = local_d08;
      UnionState::UnionState(&local_cf4,discriminants_45,0x50);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__41>
                (&local_d2c,&local_d2d,initializer_40);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 6,0,0}, 80)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s16(1);}))\", UnionState({0, 6,0,0}, 80), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s16(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0, 6,0,0}, 80)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s16(1);}))"
                 ,&local_cf4,&local_d2c);
      local_cde = false;
    }
  }
  local_d68[0] = 0;
  local_d68[1] = 7;
  local_d68[2] = 0;
  local_d68[3] = 0;
  local_d58 = local_d68;
  local_d50 = 4;
  discriminants_44._M_len = 4;
  discriminants_44._M_array = local_d58;
  UnionState::UnionState(&local_d44,discriminants_44,0x60);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__42>
            ((UnionState *)local_d7c,&local_d7d,initializer_41);
  bVar1 = UnionState::operator==(&local_d44,(UnionState *)local_d7c);
  if (!bVar1) {
    local_d7e = kj::_::Debug::shouldLog(ERROR);
    while (local_d7e != false) {
      local_db8[0] = 0;
      local_db8[1] = 7;
      local_db8[2] = 0;
      local_db8[3] = 0;
      local_da8 = local_db8;
      local_da0 = 4;
      discriminants_43._M_len = 4;
      discriminants_43._M_array = local_da8;
      UnionState::UnionState(&local_d94,discriminants_43,0x60);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__43>
                (&local_dcc,&local_dcd,initializer_42);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xdd,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 7,0,0}, 96)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s32(1);}))\", UnionState({0, 7,0,0}, 96), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s32(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0, 7,0,0}, 96)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s32(1);}))"
                 ,&local_d94,&local_dcc);
      local_d7e = false;
    }
  }
  local_e08[0] = 0;
  local_e08[1] = 8;
  local_e08[2] = 0;
  local_e08[3] = 0;
  local_df8 = local_e08;
  local_df0 = 4;
  discriminants_42._M_len = 4;
  discriminants_42._M_array = local_df8;
  UnionState::UnionState(&local_de4,discriminants_42,0x60);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__44>
            ((UnionState *)local_e1c,&local_e1d,initializer_43);
  bVar1 = UnionState::operator==(&local_de4,(UnionState *)local_e1c);
  if (!bVar1) {
    local_e1e = kj::_::Debug::shouldLog(ERROR);
    while (local_e1e != false) {
      local_e58[0] = 0;
      local_e58[1] = 8;
      local_e58[2] = 0;
      local_e58[3] = 0;
      local_e48 = local_e58;
      local_e40 = 4;
      discriminants_41._M_len = 4;
      discriminants_41._M_array = local_e48;
      UnionState::UnionState(&local_e34,discriminants_41,0x60);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__45>
                (&local_e6c,&local_e6d,initializer_44);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xde,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 8,0,0}, 96)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s32(1);}))\", UnionState({0, 8,0,0}, 96), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s32(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0, 8,0,0}, 96)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s32(1);}))"
                 ,&local_e34,&local_e6c);
      local_e1e = false;
    }
  }
  local_ea8[0] = 0;
  local_ea8[1] = 9;
  local_ea8[2] = 0;
  local_ea8[3] = 0;
  local_e98 = local_ea8;
  local_e90 = 4;
  discriminants_40._M_len = 4;
  discriminants_40._M_array = local_e98;
  UnionState::UnionState(&local_e84,discriminants_40,0x80);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__46>
            ((UnionState *)local_ebc,&local_ebd,initializer_45);
  bVar1 = UnionState::operator==(&local_e84,(UnionState *)local_ebc);
  if (!bVar1) {
    local_ebe = kj::_::Debug::shouldLog(ERROR);
    while (local_ebe != false) {
      local_ef8[0] = 0;
      local_ef8[1] = 9;
      local_ef8[2] = 0;
      local_ef8[3] = 0;
      local_ee8 = local_ef8;
      local_ee0 = 4;
      discriminants_39._M_len = 4;
      discriminants_39._M_array = local_ee8;
      UnionState::UnionState(&local_ed4,discriminants_39,0x80);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__47>
                (&local_f0c,&local_f0d,initializer_46);
      kj::_::Debug::
      log<char_const(&)[130],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"(UnionState({0, 9,0,0}, 128)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s64(1);}))\", UnionState({0, 9,0,0}, 128), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s64(1);})"
                 ,(char (*) [130])
                  "failed: expected (UnionState({0, 9,0,0}, 128)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0s64(1);}))"
                 ,&local_ed4,&local_f0c);
      local_ebe = false;
    }
  }
  local_f48[0] = 0;
  local_f48[1] = 10;
  local_f48[2] = 0;
  local_f48[3] = 0;
  local_f38 = local_f48;
  local_f30 = 4;
  discriminants_38._M_len = 4;
  discriminants_38._M_array = local_f38;
  UnionState::UnionState(&local_f24,discriminants_38,0x80);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__48>
            ((UnionState *)local_f5c,&local_f5d,initializer_47);
  bVar1 = UnionState::operator==(&local_f24,(UnionState *)local_f5c);
  if (!bVar1) {
    local_f5e = kj::_::Debug::shouldLog(ERROR);
    while (local_f5e != false) {
      local_f98[0] = 0;
      local_f98[1] = 10;
      local_f98[2] = 0;
      local_f98[3] = 0;
      local_f88 = local_f98;
      local_f80 = 4;
      discriminants_37._M_len = 4;
      discriminants_37._M_array = local_f88;
      UnionState::UnionState(&local_f74,discriminants_37,0x80);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__49>
                (&local_fac,&local_fad,initializer_48);
      kj::_::Debug::
      log<char_const(&)[130],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"(UnionState({0,10,0,0}, 128)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s64(1);}))\", UnionState({0,10,0,0}, 128), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s64(1);})"
                 ,(char (*) [130])
                  "failed: expected (UnionState({0,10,0,0}, 128)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1s64(1);}))"
                 ,&local_f74,&local_fac);
      local_f5e = false;
    }
  }
  local_fe8[0] = 0;
  local_fe8[1] = 0xb;
  local_fe8[2] = 0;
  local_fe8[3] = 0;
  local_fd8 = local_fe8;
  local_fd0 = 4;
  discriminants_36._M_len = 4;
  discriminants_36._M_array = local_fd8;
  UnionState::UnionState(&local_fc4,discriminants_36,0x200);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__50>
            ((UnionState *)local_ffc,&local_ffd,initializer_49);
  bVar1 = UnionState::operator==(&local_fc4,(UnionState *)local_ffc);
  if (!bVar1) {
    local_ffe = kj::_::Debug::shouldLog(ERROR);
    while (local_ffe != false) {
      local_1038[0] = 0;
      local_1038[1] = 0xb;
      local_1038[2] = 0;
      local_1038[3] = 0;
      local_1028 = local_1038;
      local_1020 = 4;
      discriminants_35._M_len = 4;
      discriminants_35._M_array = local_1028;
      UnionState::UnionState(&local_1014,discriminants_35,0x200);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__51>
                (&local_104c,&local_104d,initializer_50);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(UnionState({0,11,0,0}, 512)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0sp(\\\"1\\\");}))\", UnionState({0,11,0,0}, 512), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0sp(\"1\");})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({0,11,0,0}, 512)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f0sp(\"1\");}))"
                 ,&local_1014,&local_104c);
      local_ffe = false;
    }
  }
  local_1088[0] = 0;
  local_1088[1] = 0xc;
  local_1088[2] = 0;
  local_1088[3] = 0;
  local_1078 = local_1088;
  local_1070 = 4;
  discriminants_34._M_len = 4;
  discriminants_34._M_array = local_1078;
  UnionState::UnionState(&local_1064,discriminants_34,0x200);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__52>
            ((UnionState *)local_109c,&local_109d,initializer_51);
  bVar1 = UnionState::operator==(&local_1064,(UnionState *)local_109c);
  if (!bVar1) {
    local_109e = kj::_::Debug::shouldLog(ERROR);
    while (local_109e != false) {
      local_10d8[0] = 0;
      local_10d8[1] = 0xc;
      local_10d8[2] = 0;
      local_10d8[3] = 0;
      local_10c8 = local_10d8;
      local_10c0 = 4;
      discriminants_33._M_len = 4;
      discriminants_33._M_array = local_10c8;
      UnionState::UnionState(&local_10b4,discriminants_33,0x200);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__53>
                (&local_10ec,&local_10ed,initializer_52);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe2,ERROR,
                 "\"failed: expected \" \"(UnionState({0,12,0,0}, 512)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1sp(\\\"1\\\");}))\", UnionState({0,12,0,0}, 512), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1sp(\"1\");})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({0,12,0,0}, 512)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f1sp(\"1\");}))"
                 ,&local_10b4,&local_10ec);
      local_109e = false;
    }
  }
  local_1128[0] = 0;
  local_1128[1] = 0xd;
  local_1128[2] = 0;
  local_1128[3] = 0;
  local_1118 = local_1128;
  local_1110 = 4;
  discriminants_32._M_len = 4;
  discriminants_32._M_array = local_1118;
  UnionState::UnionState(&local_1104,discriminants_32,-1);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__54>
            ((UnionState *)local_113c,&local_113d,initializer_53);
  bVar1 = UnionState::operator==(&local_1104,(UnionState *)local_113c);
  if (!bVar1) {
    local_113e = kj::_::Debug::shouldLog(ERROR);
    while (local_113e != false) {
      local_1178[0] = 0;
      local_1178[1] = 0xd;
      local_1178[2] = 0;
      local_1178[3] = 0;
      local_1168 = local_1178;
      local_1160 = 4;
      discriminants_31._M_len = 4;
      discriminants_31._M_array = local_1168;
      UnionState::UnionState(&local_1154,discriminants_31,-1);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__55>
                (&local_118c,&local_118d,initializer_54);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe4,ERROR,
                 "\"failed: expected \" \"(UnionState({0,13,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s0(VOID);}))\", UnionState({0,13,0,0}, -1), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s0(VOID);})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({0,13,0,0}, -1)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s0(VOID);}))"
                 ,&local_1154,&local_118c);
      local_113e = false;
    }
  }
  local_11c8[0] = 0;
  local_11c8[1] = 0xe;
  local_11c8[2] = 0;
  local_11c8[3] = 0;
  local_11b8 = local_11c8;
  local_11b0 = 4;
  discriminants_30._M_len = 4;
  discriminants_30._M_array = local_11b8;
  UnionState::UnionState(&local_11a4,discriminants_30,0x41);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__56>
            ((UnionState *)local_11dc,&local_11dd,initializer_55);
  bVar1 = UnionState::operator==(&local_11a4,(UnionState *)local_11dc);
  if (!bVar1) {
    local_11de = kj::_::Debug::shouldLog(ERROR);
    while (local_11de != false) {
      local_1218[0] = 0;
      local_1218[1] = 0xe;
      local_1218[2] = 0;
      local_1218[3] = 0;
      local_1208 = local_1218;
      local_1200 = 4;
      discriminants_29._M_len = 4;
      discriminants_29._M_array = local_1208;
      UnionState::UnionState(&local_11f4,discriminants_29,0x41);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__57>
                (&local_122c,&local_122d,initializer_56);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"(UnionState({0,14,0,0}, 65)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s1(1);}))\", UnionState({0,14,0,0}, 65), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s1(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0,14,0,0}, 65)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s1(1);}))"
                 ,&local_11f4,&local_122c);
      local_11de = false;
    }
  }
  local_1268[0] = 0;
  local_1268[1] = 0xf;
  local_1268[2] = 0;
  local_1268[3] = 0;
  local_1258 = local_1268;
  local_1250 = 4;
  discriminants_28._M_len = 4;
  discriminants_28._M_array = local_1258;
  UnionState::UnionState(&local_1244,discriminants_28,0x48);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__58>
            ((UnionState *)local_127c,&local_127d,initializer_57);
  bVar1 = UnionState::operator==(&local_1244,(UnionState *)local_127c);
  if (!bVar1) {
    local_127e = kj::_::Debug::shouldLog(ERROR);
    while (local_127e != false) {
      local_12b8[0] = 0;
      local_12b8[1] = 0xf;
      local_12b8[2] = 0;
      local_12b8[3] = 0;
      local_12a8 = local_12b8;
      local_12a0 = 4;
      discriminants_27._M_len = 4;
      discriminants_27._M_array = local_12a8;
      UnionState::UnionState(&local_1294,discriminants_27,0x48);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__59>
                (&local_12cc,&local_12cd,initializer_58);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"(UnionState({0,15,0,0}, 72)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s8(1);}))\", UnionState({0,15,0,0}, 72), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s8(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0,15,0,0}, 72)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s8(1);}))"
                 ,&local_1294,&local_12cc);
      local_127e = false;
    }
  }
  local_1308[0] = 0;
  local_1308[1] = 0x10;
  local_1308[2] = 0;
  local_1308[3] = 0;
  local_12f8 = local_1308;
  local_12f0 = 4;
  discriminants_26._M_len = 4;
  discriminants_26._M_array = local_12f8;
  UnionState::UnionState(&local_12e4,discriminants_26,0x50);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__60>
            ((UnionState *)local_131c,&local_131d,initializer_59);
  bVar1 = UnionState::operator==(&local_12e4,(UnionState *)local_131c);
  if (!bVar1) {
    local_131e = kj::_::Debug::shouldLog(ERROR);
    while (local_131e != false) {
      local_1358[0] = 0;
      local_1358[1] = 0x10;
      local_1358[2] = 0;
      local_1358[3] = 0;
      local_1348 = local_1358;
      local_1340 = 4;
      discriminants_25._M_len = 4;
      discriminants_25._M_array = local_1348;
      UnionState::UnionState(&local_1334,discriminants_25,0x50);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__61>
                (&local_136c,&local_136d,initializer_60);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe7,ERROR,
                 "\"failed: expected \" \"(UnionState({0,16,0,0}, 80)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s16(1);}))\", UnionState({0,16,0,0}, 80), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s16(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,16,0,0}, 80)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s16(1);}))"
                 ,&local_1334,&local_136c);
      local_131e = false;
    }
  }
  local_13a8[0] = 0;
  local_13a8[1] = 0x11;
  local_13a8[2] = 0;
  local_13a8[3] = 0;
  local_1398 = local_13a8;
  local_1390 = 4;
  discriminants_24._M_len = 4;
  discriminants_24._M_array = local_1398;
  UnionState::UnionState(&local_1384,discriminants_24,0x60);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__62>
            ((UnionState *)local_13bc,&local_13bd,initializer_61);
  bVar1 = UnionState::operator==(&local_1384,(UnionState *)local_13bc);
  if (!bVar1) {
    local_13be = kj::_::Debug::shouldLog(ERROR);
    while (local_13be != false) {
      local_13f8[0] = 0;
      local_13f8[1] = 0x11;
      local_13f8[2] = 0;
      local_13f8[3] = 0;
      local_13e8 = local_13f8;
      local_13e0 = 4;
      discriminants_23._M_len = 4;
      discriminants_23._M_array = local_13e8;
      UnionState::UnionState(&local_13d4,discriminants_23,0x60);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__63>
                (&local_140c,&local_140d,initializer_62);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe8,ERROR,
                 "\"failed: expected \" \"(UnionState({0,17,0,0}, 96)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s32(1);}))\", UnionState({0,17,0,0}, 96), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s32(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,17,0,0}, 96)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s32(1);}))"
                 ,&local_13d4,&local_140c);
      local_13be = false;
    }
  }
  local_1448[0] = 0;
  local_1448[1] = 0x12;
  local_1448[2] = 0;
  local_1448[3] = 0;
  local_1438 = local_1448;
  local_1430 = 4;
  discriminants_22._M_len = 4;
  discriminants_22._M_array = local_1438;
  UnionState::UnionState(&local_1424,discriminants_22,0x80);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__64>
            ((UnionState *)local_145c,&local_145d,initializer_63);
  bVar1 = UnionState::operator==(&local_1424,(UnionState *)local_145c);
  if (!bVar1) {
    local_145e = kj::_::Debug::shouldLog(ERROR);
    while (local_145e != false) {
      local_1498[0] = 0;
      local_1498[1] = 0x12;
      local_1498[2] = 0;
      local_1498[3] = 0;
      local_1488 = local_1498;
      local_1480 = 4;
      discriminants_21._M_len = 4;
      discriminants_21._M_array = local_1488;
      UnionState::UnionState(&local_1474,discriminants_21,0x80);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__65>
                (&local_14ac,&local_14ad,initializer_64);
      kj::_::Debug::
      log<char_const(&)[130],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xe9,ERROR,
                 "\"failed: expected \" \"(UnionState({0,18,0,0}, 128)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s64(1);}))\", UnionState({0,18,0,0}, 128), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s64(1);})"
                 ,(char (*) [130])
                  "failed: expected (UnionState({0,18,0,0}, 128)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2s64(1);}))"
                 ,&local_1474,&local_14ac);
      local_145e = false;
    }
  }
  local_14e8[0] = 0;
  local_14e8[1] = 0x13;
  local_14e8[2] = 0;
  local_14e8[3] = 0;
  local_14d8 = local_14e8;
  local_14d0 = 4;
  discriminants_20._M_len = 4;
  discriminants_20._M_array = local_14d8;
  UnionState::UnionState(&local_14c4,discriminants_20,0x200);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__66>
            ((UnionState *)local_14fc,&local_14fd,initializer_65);
  bVar1 = UnionState::operator==(&local_14c4,(UnionState *)local_14fc);
  if (!bVar1) {
    local_14fe = kj::_::Debug::shouldLog(ERROR);
    while (local_14fe != false) {
      local_1538[0] = 0;
      local_1538[1] = 0x13;
      local_1538[2] = 0;
      local_1538[3] = 0;
      local_1528 = local_1538;
      local_1520 = 4;
      discriminants_19._M_len = 4;
      discriminants_19._M_array = local_1528;
      UnionState::UnionState(&local_1514,discriminants_19,0x200);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__67>
                (&local_154c,&local_154d,initializer_66);
      kj::_::Debug::
      log<char_const(&)[131],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(UnionState({0,19,0,0}, 512)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2sp(\\\"1\\\");}))\", UnionState({0,19,0,0}, 512), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2sp(\"1\");})"
                 ,(char (*) [131])
                  "failed: expected (UnionState({0,19,0,0}, 512)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion1().setU1f2sp(\"1\");}))"
                 ,&local_1514,&local_154c);
      local_14fe = false;
    }
  }
  local_1588[0] = 0;
  local_1588[1] = 0;
  local_1588[2] = 0;
  local_1588[3] = 0;
  local_1578 = local_1588;
  local_1570 = 4;
  discriminants_18._M_len = 4;
  discriminants_18._M_array = local_1578;
  UnionState::UnionState(&local_1564,discriminants_18,0xc0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__68>
            ((UnionState *)local_159c,&local_159d,initializer_67);
  bVar1 = UnionState::operator==(&local_1564,(UnionState *)local_159c);
  if (!bVar1) {
    local_159e = kj::_::Debug::shouldLog(ERROR);
    while (local_159e != false) {
      local_15d8[0] = 0;
      local_15d8[1] = 0;
      local_15d8[2] = 0;
      local_15d8[3] = 0;
      local_15c8 = local_15d8;
      local_15c0 = 4;
      discriminants_17._M_len = 4;
      discriminants_17._M_array = local_15c8;
      UnionState::UnionState(&local_15b4,discriminants_17,0xc0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__69>
                (&local_15ec,&local_15ed,initializer_68);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,0,0}, 192)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s1(1);}))\", UnionState({0,0,0,0}, 192), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s1(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0,0,0,0}, 192)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s1(1);}))"
                 ,&local_15b4,&local_15ec);
      local_159e = false;
    }
  }
  local_1628[0] = 0;
  local_1628[1] = 0;
  local_1628[2] = 0;
  local_1628[3] = 0;
  local_1618 = local_1628;
  local_1610 = 4;
  discriminants_16._M_len = 4;
  discriminants_16._M_array = local_1618;
  UnionState::UnionState(&local_1604,discriminants_16,0xc1);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__70>
            ((UnionState *)local_163c,&local_163d,initializer_69);
  bVar1 = UnionState::operator==(&local_1604,(UnionState *)local_163c);
  if (!bVar1) {
    local_163e = kj::_::Debug::shouldLog(ERROR);
    while (local_163e != false) {
      local_1678[0] = 0;
      local_1678[1] = 0;
      local_1678[2] = 0;
      local_1678[3] = 0;
      local_1668 = local_1678;
      local_1660 = 4;
      discriminants_15._M_len = 4;
      discriminants_15._M_array = local_1668;
      UnionState::UnionState(&local_1654,discriminants_15,0xc1);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__71>
                (&local_168c,&local_168d,initializer_70);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,0,0}, 193)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s1(1);}))\", UnionState({0,0,0,0}, 193), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s1(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0,0,0,0}, 193)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s1(1);}))"
                 ,&local_1654,&local_168c);
      local_163e = false;
    }
  }
  local_16c8[0] = 0;
  local_16c8[1] = 0;
  local_16c8[2] = 1;
  local_16c8[3] = 0;
  local_16b8 = local_16c8;
  local_16b0 = 4;
  discriminants_14._M_len = 4;
  discriminants_14._M_array = local_16b8;
  UnionState::UnionState(&local_16a4,discriminants_14,200);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__72>
            ((UnionState *)local_16dc,&local_16dd,initializer_71);
  bVar1 = UnionState::operator==(&local_16a4,(UnionState *)local_16dc);
  if (!bVar1) {
    local_16de = kj::_::Debug::shouldLog(ERROR);
    while (local_16de != false) {
      local_1718[0] = 0;
      local_1718[1] = 0;
      local_1718[2] = 1;
      local_1718[3] = 0;
      local_1708 = local_1718;
      local_1700 = 4;
      discriminants_13._M_len = 4;
      discriminants_13._M_array = local_1708;
      UnionState::UnionState(&local_16f4,discriminants_13,200);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__73>
                (&local_172c,&local_172d,initializer_72);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,1,0}, 200)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s8(1);}))\", UnionState({0,0,1,0}, 200), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s8(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0,0,1,0}, 200)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s8(1);}))"
                 ,&local_16f4,&local_172c);
      local_16de = false;
    }
  }
  local_1768[0] = 0;
  local_1768[1] = 0;
  local_1768[2] = 0;
  local_1768[3] = 1;
  local_1758 = local_1768;
  local_1750 = 4;
  discriminants_12._M_len = 4;
  discriminants_12._M_array = local_1758;
  UnionState::UnionState(&local_1744,discriminants_12,0xd0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__74>
            ((UnionState *)local_177c,&local_177d,initializer_73);
  bVar1 = UnionState::operator==(&local_1744,(UnionState *)local_177c);
  if (!bVar1) {
    local_177e = kj::_::Debug::shouldLog(ERROR);
    while (local_177e != false) {
      local_17b8[0] = 0;
      local_17b8[1] = 0;
      local_17b8[2] = 0;
      local_17b8[3] = 1;
      local_17a8 = local_17b8;
      local_17a0 = 4;
      discriminants_11._M_len = 4;
      discriminants_11._M_array = local_17a8;
      UnionState::UnionState(&local_1794,discriminants_11,0xd0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__75>
                (&local_17cc,&local_17cd,initializer_74);
      kj::_::Debug::
      log<char_const(&)[128],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,0,1}, 208)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s8(1);}))\", UnionState({0,0,0,1}, 208), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s8(1);})"
                 ,(char (*) [128])
                  "failed: expected (UnionState({0,0,0,1}, 208)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s8(1);}))"
                 ,&local_1794,&local_17cc);
      local_177e = false;
    }
  }
  local_1808[0] = 0;
  local_1808[1] = 0;
  local_1808[2] = 2;
  local_1808[3] = 0;
  local_17f8 = local_1808;
  local_17f0 = 4;
  discriminants_10._M_len = 4;
  discriminants_10._M_array = local_17f8;
  UnionState::UnionState(&local_17e4,discriminants_10,0xe0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__76>
            ((UnionState *)local_181c,&local_181d,initializer_75);
  bVar1 = UnionState::operator==(&local_17e4,(UnionState *)local_181c);
  if (!bVar1) {
    local_181e = kj::_::Debug::shouldLog(ERROR);
    while (local_181e != false) {
      local_1858[0] = 0;
      local_1858[1] = 0;
      local_1858[2] = 2;
      local_1858[3] = 0;
      local_1848 = local_1858;
      local_1840 = 4;
      discriminants_09._M_len = 4;
      discriminants_09._M_array = local_1848;
      UnionState::UnionState(&local_1834,discriminants_09,0xe0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__77>
                (&local_186c,&local_186d,initializer_76);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,2,0}, 224)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s16(1);}))\", UnionState({0,0,2,0}, 224), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s16(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,0,2,0}, 224)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s16(1);}))"
                 ,&local_1834,&local_186c);
      local_181e = false;
    }
  }
  local_18a8[0] = 0;
  local_18a8[1] = 0;
  local_18a8[2] = 0;
  local_18a8[3] = 2;
  local_1898 = local_18a8;
  local_1890 = 4;
  discriminants_08._M_len = 4;
  discriminants_08._M_array = local_1898;
  UnionState::UnionState(&local_1884,discriminants_08,0xf0);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__78>
            ((UnionState *)local_18bc,&local_18bd,initializer_77);
  bVar1 = UnionState::operator==(&local_1884,(UnionState *)local_18bc);
  if (!bVar1) {
    local_18be = kj::_::Debug::shouldLog(ERROR);
    while (local_18be != false) {
      local_18f8[0] = 0;
      local_18f8[1] = 0;
      local_18f8[2] = 0;
      local_18f8[3] = 2;
      local_18e8 = local_18f8;
      local_18e0 = 4;
      discriminants_07._M_len = 4;
      discriminants_07._M_array = local_18e8;
      UnionState::UnionState(&local_18d4,discriminants_07,0xf0);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__79>
                (&local_190c,&local_190d,initializer_78);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,0,2}, 240)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s16(1);}))\", UnionState({0,0,0,2}, 240), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s16(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,0,0,2}, 240)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s16(1);}))"
                 ,&local_18d4,&local_190c);
      local_18be = false;
    }
  }
  local_1948[0] = 0;
  local_1948[1] = 0;
  local_1948[2] = 3;
  local_1948[3] = 0;
  local_1938 = local_1948;
  local_1930 = 4;
  discriminants_06._M_len = 4;
  discriminants_06._M_array = local_1938;
  UnionState::UnionState(&local_1924,discriminants_06,0x100);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__80>
            ((UnionState *)local_195c,&local_195d,initializer_79);
  bVar1 = UnionState::operator==(&local_1924,(UnionState *)local_195c);
  if (!bVar1) {
    local_195e = kj::_::Debug::shouldLog(ERROR);
    while (local_195e != false) {
      local_1998[0] = 0;
      local_1998[1] = 0;
      local_1998[2] = 3;
      local_1998[3] = 0;
      local_1988 = local_1998;
      local_1980 = 4;
      discriminants_05._M_len = 4;
      discriminants_05._M_array = local_1988;
      UnionState::UnionState(&local_1974,discriminants_05,0x100);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__81>
                (&local_19ac,&local_19ad,initializer_80);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,3,0}, 256)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s32(1);}))\", UnionState({0,0,3,0}, 256), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s32(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,0,3,0}, 256)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s32(1);}))"
                 ,&local_1974,&local_19ac);
      local_195e = false;
    }
  }
  local_19e8[0] = 0;
  local_19e8[1] = 0;
  local_19e8[2] = 0;
  local_19e8[3] = 3;
  local_19d8 = local_19e8;
  local_19d0 = 4;
  discriminants_04._M_len = 4;
  discriminants_04._M_array = local_19d8;
  UnionState::UnionState(&local_19c4,discriminants_04,0x120);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__82>
            ((UnionState *)local_19fc,&local_19fd,initializer_81);
  bVar1 = UnionState::operator==(&local_19c4,(UnionState *)local_19fc);
  if (!bVar1) {
    local_19fe = kj::_::Debug::shouldLog(ERROR);
    while (local_19fe != false) {
      local_1a38[0] = 0;
      local_1a38[1] = 0;
      local_1a38[2] = 0;
      local_1a38[3] = 3;
      local_1a28 = local_1a38;
      local_1a20 = 4;
      discriminants_03._M_len = 4;
      discriminants_03._M_array = local_1a28;
      UnionState::UnionState(&local_1a14,discriminants_03,0x120);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__83>
                (&local_1a4c,&local_1a4d,initializer_82);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xf3,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,0,3}, 288)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s32(1);}))\", UnionState({0,0,0,3}, 288), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s32(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,0,0,3}, 288)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s32(1);}))"
                 ,&local_1a14,&local_1a4c);
      local_19fe = false;
    }
  }
  local_1a88[0] = 0;
  local_1a88[1] = 0;
  local_1a88[2] = 4;
  local_1a88[3] = 0;
  local_1a78 = local_1a88;
  local_1a70 = 4;
  discriminants_02._M_len = 4;
  discriminants_02._M_array = local_1a78;
  UnionState::UnionState(&local_1a64,discriminants_02,0x140);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__84>
            ((UnionState *)local_1a9c,&local_1a9d,initializer_83);
  bVar1 = UnionState::operator==(&local_1a64,(UnionState *)local_1a9c);
  if (!bVar1) {
    local_1a9e = kj::_::Debug::shouldLog(ERROR);
    while (local_1a9e != false) {
      local_1ad8[0] = 0;
      local_1ad8[1] = 0;
      local_1ad8[2] = 4;
      local_1ad8[3] = 0;
      local_1ac8 = local_1ad8;
      local_1ac0 = 4;
      discriminants_01._M_len = 4;
      discriminants_01._M_array = local_1ac8;
      UnionState::UnionState(&local_1ab4,discriminants_01,0x140);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__85>
                (&local_1aec,&local_1aed,initializer_84);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,4,0}, 320)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s64(1);}))\", UnionState({0,0,4,0}, 320), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s64(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,0,4,0}, 320)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion2().setU2f0s64(1);}))"
                 ,&local_1ab4,&local_1aec);
      local_1a9e = false;
    }
  }
  local_1b28[0] = 0;
  local_1b28[1] = 0;
  local_1b28[2] = 0;
  local_1b28[3] = 4;
  local_1b18 = local_1b28;
  local_1b10 = 4;
  discriminants_00._M_len = 4;
  discriminants_00._M_array = local_1b18;
  UnionState::UnionState(&local_1b04,discriminants_00,0x180);
  (anonymous_namespace)::
  initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__86>
            ((UnionState *)local_1b3c,&local_1b3d,initializer_85);
  bVar1 = UnionState::operator==(&local_1b04,(UnionState *)local_1b3c);
  if (!bVar1) {
    local_1b3e = kj::_::Debug::shouldLog(ERROR);
    while (local_1b3e != false) {
      local_1b78[0] = 0;
      local_1b78[1] = 0;
      local_1b78[2] = 0;
      local_1b78[3] = 4;
      local_1b68 = local_1b78;
      local_1b60 = 4;
      discriminants._M_len = 4;
      discriminants._M_array = local_1b68;
      UnionState::UnionState(&local_1b54,discriminants,0x180);
      (anonymous_namespace)::
      initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__87>
                (&local_1b8c,&local_1b8d,initializer_86);
      kj::_::Debug::
      log<char_const(&)[129],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"(UnionState({0,0,0,4}, 384)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s64(1);}))\", UnionState({0,0,0,4}, 384), initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s64(1);})"
                 ,(char (*) [129])
                  "failed: expected (UnionState({0,0,0,4}, 384)) == (initUnion<TestUnion>([](TestUnion::Builder b) {b.getUnion3().setU3f0s64(1);}))"
                 ,&local_1b54,&local_1b8c);
      local_1b3e = false;
    }
  }
  return;
}

Assistant:

TEST(Encoding, UnionLayout) {
#define INIT_UNION(setter) \
  initUnion<TestUnion>([](TestUnion::Builder b) {b.setter;})

  EXPECT_EQ(UnionState({ 0,0,0,0},  -1), INIT_UNION(getUnion0().setU0f0s0(VOID)));
  EXPECT_EQ(UnionState({ 1,0,0,0},   0), INIT_UNION(getUnion0().setU0f0s1(1)));
  EXPECT_EQ(UnionState({ 2,0,0,0},   0), INIT_UNION(getUnion0().setU0f0s8(1)));
  EXPECT_EQ(UnionState({ 3,0,0,0},   0), INIT_UNION(getUnion0().setU0f0s16(1)));
  EXPECT_EQ(UnionState({ 4,0,0,0},   0), INIT_UNION(getUnion0().setU0f0s32(1)));
  EXPECT_EQ(UnionState({ 5,0,0,0},   0), INIT_UNION(getUnion0().setU0f0s64(1)));
  EXPECT_EQ(UnionState({ 6,0,0,0}, 448), INIT_UNION(getUnion0().setU0f0sp("1")));

  EXPECT_EQ(UnionState({ 7,0,0,0},  -1), INIT_UNION(getUnion0().setU0f1s0(VOID)));
  EXPECT_EQ(UnionState({ 8,0,0,0},   0), INIT_UNION(getUnion0().setU0f1s1(1)));
  EXPECT_EQ(UnionState({ 9,0,0,0},   0), INIT_UNION(getUnion0().setU0f1s8(1)));
  EXPECT_EQ(UnionState({10,0,0,0},   0), INIT_UNION(getUnion0().setU0f1s16(1)));
  EXPECT_EQ(UnionState({11,0,0,0},   0), INIT_UNION(getUnion0().setU0f1s32(1)));
  EXPECT_EQ(UnionState({12,0,0,0},   0), INIT_UNION(getUnion0().setU0f1s64(1)));
  EXPECT_EQ(UnionState({13,0,0,0}, 448), INIT_UNION(getUnion0().setU0f1sp("1")));

  EXPECT_EQ(UnionState({0, 0,0,0},  -1), INIT_UNION(getUnion1().setU1f0s0(VOID)));
  EXPECT_EQ(UnionState({0, 1,0,0},  65), INIT_UNION(getUnion1().setU1f0s1(1)));
  EXPECT_EQ(UnionState({0, 2,0,0},  65), INIT_UNION(getUnion1().setU1f1s1(1)));
  EXPECT_EQ(UnionState({0, 3,0,0},  72), INIT_UNION(getUnion1().setU1f0s8(1)));
  EXPECT_EQ(UnionState({0, 4,0,0},  72), INIT_UNION(getUnion1().setU1f1s8(1)));
  EXPECT_EQ(UnionState({0, 5,0,0},  80), INIT_UNION(getUnion1().setU1f0s16(1)));
  EXPECT_EQ(UnionState({0, 6,0,0},  80), INIT_UNION(getUnion1().setU1f1s16(1)));
  EXPECT_EQ(UnionState({0, 7,0,0},  96), INIT_UNION(getUnion1().setU1f0s32(1)));
  EXPECT_EQ(UnionState({0, 8,0,0},  96), INIT_UNION(getUnion1().setU1f1s32(1)));
  EXPECT_EQ(UnionState({0, 9,0,0}, 128), INIT_UNION(getUnion1().setU1f0s64(1)));
  EXPECT_EQ(UnionState({0,10,0,0}, 128), INIT_UNION(getUnion1().setU1f1s64(1)));
  EXPECT_EQ(UnionState({0,11,0,0}, 512), INIT_UNION(getUnion1().setU1f0sp("1")));
  EXPECT_EQ(UnionState({0,12,0,0}, 512), INIT_UNION(getUnion1().setU1f1sp("1")));

  EXPECT_EQ(UnionState({0,13,0,0},  -1), INIT_UNION(getUnion1().setU1f2s0(VOID)));
  EXPECT_EQ(UnionState({0,14,0,0}, 65), INIT_UNION(getUnion1().setU1f2s1(1)));
  EXPECT_EQ(UnionState({0,15,0,0}, 72), INIT_UNION(getUnion1().setU1f2s8(1)));
  EXPECT_EQ(UnionState({0,16,0,0}, 80), INIT_UNION(getUnion1().setU1f2s16(1)));
  EXPECT_EQ(UnionState({0,17,0,0}, 96), INIT_UNION(getUnion1().setU1f2s32(1)));
  EXPECT_EQ(UnionState({0,18,0,0}, 128), INIT_UNION(getUnion1().setU1f2s64(1)));
  EXPECT_EQ(UnionState({0,19,0,0}, 512), INIT_UNION(getUnion1().setU1f2sp("1")));

  EXPECT_EQ(UnionState({0,0,0,0}, 192), INIT_UNION(getUnion2().setU2f0s1(1)));
  EXPECT_EQ(UnionState({0,0,0,0}, 193), INIT_UNION(getUnion3().setU3f0s1(1)));
  EXPECT_EQ(UnionState({0,0,1,0}, 200), INIT_UNION(getUnion2().setU2f0s8(1)));
  EXPECT_EQ(UnionState({0,0,0,1}, 208), INIT_UNION(getUnion3().setU3f0s8(1)));
  EXPECT_EQ(UnionState({0,0,2,0}, 224), INIT_UNION(getUnion2().setU2f0s16(1)));
  EXPECT_EQ(UnionState({0,0,0,2}, 240), INIT_UNION(getUnion3().setU3f0s16(1)));
  EXPECT_EQ(UnionState({0,0,3,0}, 256), INIT_UNION(getUnion2().setU2f0s32(1)));
  EXPECT_EQ(UnionState({0,0,0,3}, 288), INIT_UNION(getUnion3().setU3f0s32(1)));
  EXPECT_EQ(UnionState({0,0,4,0}, 320), INIT_UNION(getUnion2().setU2f0s64(1)));
  EXPECT_EQ(UnionState({0,0,0,4}, 384), INIT_UNION(getUnion3().setU3f0s64(1)));

#undef INIT_UNION
}